

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SeverityTask::~SeverityTask(SeverityTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~SeverityTask((SeverityTask *)0xb35f08);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SeverityTask(KnownSystemName knownNameId, ElabSystemTaskKind taskKind) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), taskKind(taskKind) {}